

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

int oog_encode(double u,double v)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined1 *puVar6;
  int iVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  double eps [100];
  undefined1 local_38 [8];
  
  if (oog_encode_initialized == '\0') {
    for (lVar2 = 99; lVar2 != -1; lVar2 = lVar2 + -1) {
      eps[lVar2] = 2.0;
    }
    lVar2 = 0xa3;
    while (bVar13 = lVar2 != 0, lVar2 = lVar2 + -1, bVar13) {
      iVar7 = uv_row[lVar2].nus + -1;
      iVar10 = iVar7;
      if (uv_row[lVar2].nus < 2) {
        iVar10 = 1;
      }
      if (lVar2 == 0) {
        iVar10 = 1;
      }
      if (lVar2 == 0xa2) {
        iVar10 = 1;
      }
      for (; -1 < iVar7; iVar7 = iVar7 - iVar10) {
        dVar14 = atan2(((double)(int)lVar2 + 0.5) * 0.0035000001080334187 + 0.016939999535679817 +
                       -0.473684211,
                       ((double)iVar7 + 0.5) * 0.0035000001080334187 + (double)uv_row[lVar2].ustart
                       + -0.210526316);
        dVar14 = dVar14 * 15.915494277358546 + 50.0;
        iVar1 = (int)dVar14;
        dVar14 = ABS(dVar14 - ((double)(int)dVar14 + 0.5));
        if (dVar14 < eps[iVar1]) {
          oog_encode::oog_table[iVar1] = uv_row[lVar2].ncum + iVar7;
          eps[iVar1] = dVar14;
        }
      }
    }
    puVar9 = local_38;
    iVar7 = -100;
    iVar10 = -0xc6;
    uVar11 = 0xc6;
    puVar6 = &stack0x000002d8;
    uVar5 = 100;
    while (uVar12 = uVar5 - 1, uVar5 != 0) {
      if (1.5 < eps[uVar12]) {
        iVar1 = 0;
        for (puVar8 = puVar9;
            (iVar1 != 0x31 &&
            (1.5 < *(double *)(puVar8 + (uVar5 / 100) * -800) ||
             *(double *)(puVar8 + (uVar5 / 100) * -800) == 1.5)); puVar8 = puVar8 + 8) {
          iVar1 = iVar1 + 1;
          uVar5 = uVar5 + 1;
        }
        iVar3 = 0;
        uVar5 = uVar11;
        for (puVar8 = puVar6;
            (iVar3 != -0x31 &&
            (1.5 < *(double *)(puVar8 + (uVar5 / 100) * -800) ||
             *(double *)(puVar8 + (uVar5 / 100) * -800) == 1.5)); puVar8 = puVar8 + -8) {
          iVar3 = iVar3 + -1;
          uVar5 = uVar5 - 1;
        }
        iVar4 = iVar3 - iVar10;
        if (iVar1 + 1U < 1U - iVar3) {
          iVar4 = iVar1 - iVar7;
        }
        oog_encode::oog_table[uVar12] = oog_encode::oog_table[iVar4 % 100];
      }
      iVar7 = iVar7 + 1;
      puVar9 = puVar9 + -8;
      iVar10 = iVar10 + 1;
      puVar6 = puVar6 + -8;
      uVar11 = uVar11 - 1;
      uVar5 = uVar12;
    }
    oog_encode_initialized = '\x01';
  }
  dVar14 = atan2(v + -0.473684211,u + -0.210526316);
  return oog_encode::oog_table[(int)(dVar14 * 15.915494277358546 + 50.0)];
}

Assistant:

static int oog_encode(double u, double v) /* encode out-of-gamut chroma */
{
    static int oog_table[NANGLES];
    static int initialized = 0;
    register int i;

    if (!initialized)
    { /* set up perimeter table */
        double eps[NANGLES], ua, va, ang, epsa;
        int ui, vi, ustep;
        for (i = NANGLES; i--;)
            eps[i] = 2.;
        for (vi = UV_NVS; vi--;)
        {
            va = UV_VSTART + (vi + .5) * UV_SQSIZ;
            ustep = uv_row[vi].nus - 1;
            if (vi == UV_NVS - 1 || vi == 0 || ustep <= 0)
                ustep = 1;
            for (ui = uv_row[vi].nus - 1; ui >= 0; ui -= ustep)
            {
                ua = uv_row[vi].ustart + (ui + .5) * UV_SQSIZ;
                ang = uv2ang(ua, va);
                i = (int)ang;
                epsa = fabs(ang - (i + .5));
                if (epsa < eps[i])
                {
                    oog_table[i] = uv_row[vi].ncum + ui;
                    eps[i] = epsa;
                }
            }
        }
        for (i = NANGLES; i--;) /* fill any holes */
            if (eps[i] > 1.5)
            {
                int i1, i2;
                for (i1 = 1; i1 < NANGLES / 2; i1++)
                    if (eps[(i + i1) % NANGLES] < 1.5)
                        break;
                for (i2 = 1; i2 < NANGLES / 2; i2++)
                    if (eps[(i + NANGLES - i2) % NANGLES] < 1.5)
                        break;
                if (i1 < i2)
                    oog_table[i] = oog_table[(i + i1) % NANGLES];
                else
                    oog_table[i] = oog_table[(i + NANGLES - i2) % NANGLES];
            }
        initialized = 1;
    }
    i = (int)uv2ang(u, v); /* look up hue angle */
    return (oog_table[i]);
}